

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O2

void test_mp_from_hex(void)

{
  size_t sVar1;
  mp_int *x;
  size_t i;
  ulong uVar2;
  ptrlen hex_00;
  uint8_t r [4];
  char hex [64];
  
  uVar2 = 0;
  while( true ) {
    sVar1 = (*looplimit)(8);
    if (sVar1 <= uVar2) break;
    builtin_strncpy(hex + 0x30,"0000000000000000",0x10);
    builtin_strncpy(hex + 0x20,"0000000000000000",0x10);
    builtin_strncpy(hex + 0x10,"0000000000000000",0x10);
    builtin_strncpy(hex,"0000000000000000",0x10);
    for (sVar1 = test_mp_from_decimal::starts[uVar2]; sVar1 < 0x40; sVar1 = sVar1 + 1) {
      random_read(r,4);
      hex[sVar1] = "0123456789abcdefABCDEF"
                   [(ulong)((uint)r >> 0x18 | ((uint)r & 0xff0000) >> 8 | ((uint)r & 0xff00) << 8 |
                           (int)r << 0x18) % 0x17];
    }
    log_start();
    hex_00.len = 0x40;
    hex_00.ptr = hex;
    x = mp_from_hex_pl(hex_00);
    log_end();
    mp_free(x);
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

static void test_mp_from_hex(void)
{
    char hex[64];
    static const size_t starts[] = { 0, 1, 5, 16, 23, 32, 63, 64 };
    static const char digits[] = "0123456789abcdefABCDEF";
    for (size_t i = 0; i < looplimit(lenof(starts)); i++) {
        memset(hex, '0', lenof(hex));
        for (size_t j = starts[i]; j < lenof(hex); j++) {
            uint8_t r[4];
            random_read(r, 4);
            hex[j] = digits[GET_32BIT_MSB_FIRST(r) % lenof(digits)];
        }
        log_start();
        mp_int *x = mp_from_hex_pl(make_ptrlen(hex, lenof(hex)));
        log_end();
        mp_free(x);
    }
}